

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O1

void ReadBufLine(bool Parse,bool SplitByColon)

{
  char *pcVar1;
  char cVar2;
  uint32_t uVar3;
  pointer pTVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  byte bVar12;
  size_t advanceColumns;
  uint uVar13;
  uint uVar14;
  
  line[0] = '\0';
  if (IsRunning != 0) {
    while (bVar5 = ReadBufData(), bVar5) {
      rlppos = line;
      substitutedLine = line;
      eolComment = (char *)0x0;
      bVar5 = colonSubline != true;
      if (!bVar5) {
        colonSubline = false;
        rlppos = line + 1;
        line[0] = ' ';
      }
      bVar5 = bVar5 && blockComment == 0;
      bVar6 = ReadBufData();
      if (bVar6) {
        bVar6 = true;
        do {
          bVar12 = *rlpbuf;
          if (((bVar12 == 10) || (bVar12 == 0xd)) ||
             ((blockComment == 0 && (((bVar12 == 0x3a && (SplitByColon)) && (rlppos != line))))))
          break;
          rlpbuf = rlpbuf + 1;
          *rlppos = bVar12;
          iVar9 = isalnum((uint)bVar12);
          if (((bVar12 == 0x5c) && (bVar7 = ReadBufData(), bVar7)) &&
             ((bVar12 = *rlpbuf, bVar12 == 0xd || (bVar12 == 10)))) {
            rlpbuf = rlpbuf + 1;
            bVar6 = ReadBufData();
            if ((bVar6) && ((byte)(bVar12 ^ *rlpbuf) == 7)) {
              rlpbuf = rlpbuf + 1;
            }
            TextFilePos::nextSegment
                      (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -1,false,0);
            goto LAB_0012c1c3;
          }
          if (((*rlppos == '*') && (bVar7 = ReadBufData(), bVar7)) && (*rlpbuf == '/')) {
            if (0 < blockComment) {
              blockComment = blockComment + -1;
            }
            cVar8 = '/';
LAB_0012c199:
            rlpbuf = rlpbuf + 1;
            pcVar1 = rlppos + 1;
            rlppos = rlppos + 2;
            *pcVar1 = cVar8;
          }
          else {
            if (((*rlppos == '/') && (bVar7 = ReadBufData(), bVar7)) && (*rlpbuf == '*')) {
              blockComment = blockComment + 1;
              cVar8 = '*';
              goto LAB_0012c199;
            }
            if (blockComment == 0) {
              if (bVar5) {
                iVar10 = islabchar(*rlppos);
                bVar5 = iVar10 != 0;
                if (bVar5) {
                  rlppos = rlppos + 1;
                  bVar6 = ReadBufData();
                  if ((bVar6) && (*rlpbuf == '+')) {
                    rlpbuf = rlpbuf + 1;
                    pcVar1 = rlppos + 1;
                    *rlppos = '+';
                    rlppos = pcVar1;
                    bVar5 = ReadBufData();
                    if ((bVar5) && (bVar12 = *rlpbuf, bVar12 == 0x2a || bVar12 - 0x30 < 10)) {
                      rlpbuf = rlpbuf + 1;
                      pcVar1 = rlppos + 1;
                      *rlppos = bVar12;
                      rlppos = pcVar1;
                    }
                    bVar5 = false;
                  }
                  bVar6 = ReadBufData();
                  if ((bVar6) && (*rlpbuf == ':')) {
                    rlpbuf = rlpbuf + 1;
                    pcVar1 = rlppos + 1;
                    *rlppos = ':';
                    rlppos = pcVar1;
                    bVar5 = false;
                  }
                  goto LAB_0012c1c3;
                }
              }
              else {
                bVar5 = false;
              }
              if ((*rlppos == ';') ||
                 (((*rlppos == '/' && (bVar7 = ReadBufData(), bVar7)) && (*rlpbuf == '/')))) {
                eolComment = rlppos;
                rlppos = rlppos + 1;
                while (((bVar6 = ReadBufData(), bVar6 && (cVar8 = *rlpbuf, cVar8 != '\n')) &&
                       (cVar8 != '\r'))) {
                  rlpbuf = rlpbuf + 1;
                  pcVar1 = rlppos + 1;
                  *rlppos = cVar8;
                  rlppos = pcVar1;
                }
              }
              else {
                if ((!bVar6) || ((cVar8 = *rlppos, cVar8 != '\'' && (cVar8 != '\"'))))
                goto LAB_0012c1bc;
                uVar13 = 0;
                do {
                  uVar14 = uVar13 - 1;
                  if (uVar13 == 0) {
                    uVar14 = 0;
                  }
                  rlppos = rlppos + 1;
                  bVar6 = ReadBufData();
                  pcVar1 = rlppos;
                  bVar12 = 0;
                  if (bVar6) {
                    bVar12 = *rlpbuf;
                  }
                  *rlppos = bVar12;
                  if ((bVar12 < 0xe) && ((0x2401U >> (bVar12 & 0x1f) & 1) != 0)) {
                    *pcVar1 = '\0';
                  }
                  else {
                    rlpbuf = rlpbuf + 1;
                  }
                  if ((cVar8 == '\"') && (uVar13 < 2)) {
                    uVar14 = (uint)(*pcVar1 == '\\') * 2;
                  }
                  uVar13 = uVar14;
                  cVar2 = *pcVar1;
                  if (cVar2 == '\0') goto LAB_0012c1c3;
                } while ((uVar13 != 0) ||
                        (uVar13 = 0, (uint)(cVar8 != '\"') * 5 + 0x22 != (int)cVar2));
                if (cVar2 != '\0') {
                  rlppos = pcVar1 + 1;
                }
              }
            }
            else {
LAB_0012c1bc:
              rlppos = rlppos + 1;
            }
          }
LAB_0012c1c3:
          bVar7 = ReadBufData();
          bVar6 = iVar9 == 0;
        } while (bVar7);
      }
      *rlppos = '\0';
      bVar5 = ReadBufData();
      if ((bVar5) && ((bVar12 = *rlpbuf, bVar12 == 0xd || (bVar12 == 10)))) {
        rlpbuf = rlpbuf + 1;
        bVar5 = ReadBufData();
        if ((bVar5) && ((byte)(bVar12 ^ *rlpbuf) == 7)) {
          rlpbuf = rlpbuf + 1;
        }
        bVar5 = ReadBufData();
        if ((!bVar5) && (line[0] != '\0')) {
          pcVar1 = rlpbuf_end + 1;
          *rlpbuf_end = '\n';
          rlpbuf_end = pcVar1;
        }
      }
      else if (SplitByColon) {
        bVar5 = ReadBufData();
        if ((bVar5) && (*rlpbuf == ':')) {
          rlpbuf = rlpbuf + 1;
          colonSubline = true;
        }
        else {
          colonSubline = false;
        }
      }
      else {
        colonSubline = false;
      }
      bVar5 = colonSubline;
      pTVar4 = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_start ==
          sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        __assert_fail("!sourcePosStack.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/sjio.cpp"
                      ,0x33c,"void ReadBufLine(bool, bool)");
      }
      if (colonSubline == true) {
        uVar3 = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl
                .super__Vector_impl_data._M_finish[-1].colEnd;
        sVar11 = strlen(line);
        advanceColumns = sVar11 + (uVar3 == 0);
      }
      else {
        advanceColumns = 0;
      }
      TextFilePos::nextSegment(pTVar4 + -1,bVar5,advanceColumns);
      if (!Parse) {
        return;
      }
      ParseLine(true);
      if (IsRunning == 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

void ReadBufLine(bool Parse, bool SplitByColon) {
	// if everything else fails (no data, not running, etc), return empty line
	*line = 0;
	bool IsLabel = true;
	// try to read through the buffer and produce new line from it
	while (IsRunning && ReadBufData()) {
		// start of new line (or fake "line" by colon)
		rlppos = line;
		substitutedLine = line;		// also reset "substituted" line to the raw new one
		eolComment = NULL;
		if (colonSubline) {			// starting from colon (creating new fake "line")
			colonSubline = false;	// (can't happen inside block comment)
			*(rlppos++) = ' ';
			IsLabel = false;
		} else {					// starting real new line
			IsLabel = (0 == blockComment);
		}
		bool afterNonAlphaNum, afterNonAlphaNumNext = true;
		// copy data from read buffer into `line` buffer until EOL/colon is found
		while (
				ReadBufData() && '\n' != *rlpbuf && '\r' != *rlpbuf &&	// split by EOL
				// split by colon only on 2nd+ char && SplitByColon && not inside block comment
				(blockComment || !SplitByColon || rlppos == line || ':' != *rlpbuf)) {
			// copy the new character to new line
			*rlppos = *rlpbuf++;
			afterNonAlphaNum = afterNonAlphaNumNext;
			afterNonAlphaNumNext = !isalnum((byte)*rlppos);
			// handle EOL escaping, limited implementation, usage not recommended
			if ('\\' == *rlppos && ReadBufData() && ('\r' == *rlpbuf || '\n' == *rlpbuf))  {
				char CRLFtest = (*rlpbuf++) ^ ('\r'^'\n');	// flip CR->LF || LF->CR (and eats first)
				if (ReadBufData() && CRLFtest == *rlpbuf) ++rlpbuf;	// if CRLF/LFCR pair, eat also second
				sourcePosStack.back().nextSegment();	// mark last line in errors/etc
				continue;								// continue with chars from next line
			}
			// Block comments logic first (anything serious may happen only "outside" of block comment
			if ('*' == *rlppos && ReadBufData() && '/' == *rlpbuf) {
				if (0 < blockComment) --blockComment;	// block comment ends here, -1 from nesting
				++rlppos;	*rlppos++ = *rlpbuf++;		// copy the second char too
				continue;
			}
			if ('/' == *rlppos && ReadBufData() && '*' == *rlpbuf) {
				++rlppos, ++blockComment;				// block comment starts here, nest +1 more
				*rlppos++ = *rlpbuf++;					// copy the second char too
				continue;
			}
			if (blockComment) {							// inside block comment just copy chars
				++rlppos;
				continue;
			}
			// check if still in label area, if yes, copy the finishing colon as char (don't split by it)
			if ((IsLabel = (IsLabel && islabchar(*rlppos)))) {
				++rlppos;					// label character
				//SMC offset handling
				if (ReadBufData() && '+' == *rlpbuf) {	// '+' after label, add it as SMC_offset syntax
					IsLabel = false;
					*rlppos++ = *rlpbuf++;
					if (ReadBufData() && (isdigit(byte(*rlpbuf)) || '*' == *rlpbuf)) *rlppos++ = *rlpbuf++;
				}
				if (ReadBufData() && ':' == *rlpbuf) {	// colon after label, add it
					*rlppos++ = *rlpbuf++;
					IsLabel = false;
				}
				continue;
			}
			// not in label any more, check for EOL comments ";" or "//"
			if ((';' == *rlppos) || ('/' == *rlppos && ReadBufData() && '/' == *rlpbuf)) {
				eolComment = rlppos;
				++rlppos;					// EOL comment ";"
				while (ReadBufData() && '\n' != *rlpbuf && '\r' != *rlpbuf) *rlppos++ = *rlpbuf++;
				continue;
			}
			// check for string literals - double/single quotes
			if (afterNonAlphaNum && ('"' == *rlppos || '\'' == *rlppos)) {
				const bool quotes = '"' == *rlppos;
				int escaped = 0;
				do {
					if (escaped) --escaped;
					++rlppos;				// previous char confirmed
					*rlppos = ReadBufData() ? *rlpbuf : 0;	// copy next char (if available)
					if (!*rlppos || '\r' == *rlppos || '\n' == *rlppos) *rlppos = 0;	// not valid
					else ++rlpbuf;			// buffer char read (accepted)
					if (quotes && !escaped && '\\' == *rlppos) escaped = 2;	// escape sequence detected
				} while (*rlppos && (escaped || (quotes ? '"' : '\'') != *rlppos));
				if (*rlppos) ++rlppos;		// there should be ending "/' in line buffer, confirm it
				continue;
			}
			// anything else just copy
			++rlppos;				// previous char confirmed
		} // while "some char in buffer, and it's not line delimiter"
		// line interrupted somehow, may be correctly finished, check + finalize line and process it
		*rlppos = 0;
		// skip <EOL> char sequence in read buffer
		if (ReadBufData() && ('\r' == *rlpbuf || '\n' == *rlpbuf)) {
			char CRLFtest = (*rlpbuf++) ^ ('\r'^'\n');	// flip CR->LF || LF->CR (and eats first)
			if (ReadBufData() && CRLFtest == *rlpbuf) ++rlpbuf;	// if CRLF/LFCR pair, eat also second
			// if this was very last <EOL> in file (on non-empty line), add one more fake empty line
			if (!ReadBufData() && *line) *rlpbuf_end++ = '\n';	// to make listing files "as before"
		} else {
			// advance over single colon if that was the reason to terminate line parsing
			colonSubline = SplitByColon && ReadBufData() && (':' == *rlpbuf) && ++rlpbuf;
		}
		// do +1 for very first colon-segment only (rest is +1 due to artificial space at beginning)
		assert(!sourcePosStack.empty());
		size_t advanceColumns = colonSubline ? (0 == sourcePosStack.back().colEnd) + strlen(line) : 0;
		sourcePosStack.back().nextSegment(colonSubline, advanceColumns);
		// line is parsed and ready to be processed
		if (Parse) 	ParseLine();	// processed here in loop
		else 		return;			// processed externally
	} // while (IsRunning && ReadBufData())
}